

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O1

void __thiscall
DivideTest<int>::test_random_numerators<(libdivide::Branching)1>
          (DivideTest<int> *this,int denom,divider<int,_(libdivide::Branching)1> *the_divider)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  size_t i;
  long lVar6;
  
  lVar6 = 0;
  do {
    lVar5 = 0x10;
    do {
      uVar3 = this->seed * 0x19660d + 0x3c6ef35f;
      this->seed = uVar3;
      uVar2 = this->rand_n;
      uVar1 = ((uVar3 & 1) + 1) * uVar2 + 3 + uVar2 % 0x1c9c381;
      uVar4 = uVar3 % 0x13;
      if (uVar2 <= uVar1) {
        uVar4 = uVar1;
      }
      this->rand_n = uVar4;
      uVar1 = -uVar4;
      if ((uVar3 & 1) == 0) {
        uVar1 = uVar4;
      }
      test_one<(libdivide::Branching)1>(this,uVar1,denom,the_divider);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10000);
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }